

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicRectMatrix.hpp
# Opt level: O0

void __thiscall
OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix
          (DynamicRectMatrix<double> *this,uint nrow,uint ncol)

{
  undefined4 in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  uint j;
  uint i;
  uint in_stack_ffffffffffffffe8;
  uint uVar1;
  uint in_stack_ffffffffffffffec;
  uint uVar2;
  
  allocate((DynamicRectMatrix<double> *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffec,
           in_stack_ffffffffffffffe8);
  for (uVar2 = 0; uVar2 < *(uint *)(in_RDI + 1); uVar2 = uVar2 + 1) {
    for (uVar1 = 0; uVar1 < *(uint *)((long)in_RDI + 0xc); uVar1 = uVar1 + 1) {
      *(undefined8 *)(*(long *)(*in_RDI + (ulong)uVar2 * 8) + (ulong)uVar1 * 8) = 0;
    }
  }
  return;
}

Assistant:

DynamicRectMatrix(unsigned int nrow, unsigned int ncol) {
      allocate(nrow, ncol);

      for (unsigned int i = 0; i < nrow_; i++)
        for (unsigned int j = 0; j < ncol_; j++)
          this->data_[i][j] = 0.0;
    }